

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O0

U32 duckdb_zstd::ZSTD_insertAndFindFirstIndex(ZSTD_matchState_t *ms,BYTE *ip)

{
  int iVar1;
  undefined4 uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  void *p;
  int in_ESI;
  long in_RDI;
  ZSTD_compressionParameters *cParams;
  size_t h;
  U32 idx;
  U32 target;
  BYTE *base;
  U32 chainMask;
  U32 *chainTable;
  U32 hashLog;
  U32 *hashTable;
  undefined8 in_stack_ffffffffffffff48;
  U32 UVar6;
  void *in_stack_ffffffffffffff50;
  uint local_80;
  size_t local_20;
  size_t local_8;
  
  iVar1 = *(int *)(in_RDI + 0x110);
  lVar3 = *(long *)(in_RDI + 0x70);
  lVar4 = *(long *)(in_RDI + 0x80);
  uVar2 = *(undefined4 *)(in_RDI + 0x104);
  uVar5 = in_ESI - (int)*(undefined8 *)(in_RDI + 8);
  for (local_80 = *(uint *)(in_RDI + 0x2c); local_80 < uVar5; local_80 = local_80 + 1) {
    UVar6 = (U32)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    switch(iVar1) {
    default:
      local_8 = ZSTD_hash4Ptr(in_stack_ffffffffffffff50,UVar6);
      break;
    case 5:
      local_8 = ZSTD_hash5Ptr(in_stack_ffffffffffffff50,UVar6);
      break;
    case 6:
      local_8 = ZSTD_hash6Ptr(in_stack_ffffffffffffff50,UVar6);
      break;
    case 7:
      local_8 = ZSTD_hash7Ptr(in_stack_ffffffffffffff50,UVar6);
      break;
    case 8:
      local_8 = ZSTD_hash8Ptr(in_stack_ffffffffffffff50,UVar6);
    }
    *(undefined4 *)(lVar4 + (ulong)(local_80 & (1 << ((byte)uVar2 & 0x1f)) - 1U) * 4) =
         *(undefined4 *)(lVar3 + local_8 * 4);
    *(uint *)(lVar3 + local_8 * 4) = local_80;
  }
  *(uint *)(in_RDI + 0x2c) = uVar5;
  p = (void *)(ulong)(iVar1 - 4);
  UVar6 = (U32)((ulong)lVar3 >> 0x20);
  switch(p) {
  default:
    local_20 = ZSTD_hash4Ptr(p,UVar6);
    break;
  case (void *)0x1:
    local_20 = ZSTD_hash5Ptr(p,UVar6);
    break;
  case (void *)0x2:
    local_20 = ZSTD_hash6Ptr(p,UVar6);
    break;
  case (void *)0x3:
    local_20 = ZSTD_hash7Ptr(p,UVar6);
    break;
  case (void *)0x4:
    local_20 = ZSTD_hash8Ptr(p,UVar6);
  }
  return *(U32 *)(lVar3 + local_20 * 4);
}

Assistant:

U32 ZSTD_insertAndFindFirstIndex(ZSTD_matchState_t* ms, const BYTE* ip) {
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    return ZSTD_insertAndFindFirstIndex_internal(ms, cParams, ip, ms->cParams.minMatch, /* lazySkipping*/ 0);
}